

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O2

FabSet * __thiscall
amrex::FabSet::linComb(FabSet *this,Real a,Real b,FabSet *src,int scomp,int dcomp,int ncomp)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Array4<double> dstfab;
  Array4<const_double> srcfab;
  FabSetIter fsi;
  long local_1a0;
  long local_198;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  uVar4 = (ulong)(uint)ncomp;
  FabSetIter::FabSetIter((FabSetIter *)&local_90,this);
  if (ncomp < 1) {
    uVar4 = 0;
  }
  while (local_90.currentIndex < local_90.endIndex) {
    MFIter::validbox(&local_12c,&local_90);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_d0,(FabArray<amrex::FArrayBox> *)src,&local_90);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,(FabArray<amrex::FArrayBox> *)this,&local_90);
    lVar1 = (long)local_12c.smallend.vect[1];
    uVar2 = 0;
    local_1a0 = (long)scomp << 3;
    local_198 = (long)dcomp << 3;
    while( true ) {
      lVar3 = (long)local_12c.smallend.vect[2];
      if (uVar2 == uVar4) break;
      for (; (int)lVar3 <= local_12c.bigend.vect[2]; lVar3 = lVar3 + 1) {
        lVar7 = (long)local_d0.p +
                local_d0.nstride * local_1a0 +
                (lVar3 - local_d0.begin.z) * local_d0.kstride * 8 +
                (lVar1 - local_d0.begin.y) * local_d0.jstride * 8 + (long)local_d0.begin.x * -8 +
                (long)local_12c.smallend.vect[0] * 8;
        lVar8 = (long)local_110.p +
                local_110.nstride * local_198 +
                (lVar1 - local_110.begin.y) * local_110.jstride * 8 +
                (lVar3 - local_110.begin.z) * local_110.kstride * 8 + (long)local_110.begin.x * -8 +
                (long)local_12c.smallend.vect[0] * 8;
        for (lVar5 = lVar1; lVar5 <= local_12c.bigend.vect[1]; lVar5 = lVar5 + 1) {
          if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
            lVar6 = 0;
            do {
              *(double *)(lVar8 + lVar6 * 8) =
                   *(double *)(lVar8 + lVar6 * 8) * a + *(double *)(lVar7 + lVar6 * 8) * b;
              lVar6 = lVar6 + 1;
            } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar6);
          }
          lVar7 = lVar7 + local_d0.jstride * 8;
          lVar8 = lVar8 + local_110.jstride * 8;
        }
      }
      uVar2 = uVar2 + 1;
      local_1a0 = local_1a0 + 8;
      local_198 = local_198 + 8;
    }
    MFIter::operator++(&local_90);
  }
  MFIter::~MFIter(&local_90);
  return this;
}

Assistant:

FabSet&
FabSet::linComb (Real a, Real b, const FabSet& src, int scomp, int dcomp, int ncomp)
{
    BL_ASSERT(size() == src.size());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (FabSetIter fsi(*this); fsi.isValid(); ++fsi)
    {
        const Box& bx = fsi.validbox();
        auto const srcfab =   src.array(fsi);
        auto       dstfab = this->array(fsi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            dstfab(i,j,k,n+dcomp) = a*dstfab(i,j,k,n+dcomp) + b*srcfab(i,j,k,n+scomp);
        });
    }
    return *this;
}